

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O1

int CBS_parse_rfc5280_time_internal(CBS *cbs,int is_gentime,int allow_timezone_offset,tm *out_tm)

{
  uint8_t *puVar1;
  uint8_t uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int tmp;
  CBS copy;
  int offset_minutes;
  int day;
  int offset_hours;
  int sec;
  int min;
  int hour;
  int month;
  int local_7c;
  CBS local_78;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  local_78.data = cbs->data;
  local_78.len = cbs->len;
  iVar4 = cbs_get_two_digits(&local_78,&local_7c);
  iVar5 = local_7c;
  if (is_gentime == 0) {
    if (iVar4 == 0) {
      return 0;
    }
    uVar8 = local_7c + 2000;
    if (0x31 < local_7c) {
      uVar8 = local_7c + 0x76c;
    }
    if (0x801 < (int)uVar8) {
      return 0;
    }
  }
  else {
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = cbs_get_two_digits(&local_78,&local_7c);
    if (iVar4 == 0) {
      return 0;
    }
    uVar8 = iVar5 * 100 + local_7c;
  }
  iVar5 = cbs_get_two_digits(&local_78,(int *)&local_34);
  iVar4 = 0;
  if ((((0xfffffff3 < local_34 - 0xd && iVar5 != 0) &&
       (iVar5 = cbs_get_two_digits(&local_78,&local_48), iVar5 != 0)) && (0 < local_48)) &&
     (local_34 < 0xd)) {
    iVar5 = 0x20;
    if ((0x15aaU >> (local_34 & 0x1f) & 1) == 0) {
      if ((0xa50U >> (local_34 & 0x1f) & 1) == 0) {
        if (local_34 != 2) {
          return 0;
        }
        uVar7 = uVar8 * -0x3d70a3d7 + 0x51eb850;
        iVar5 = ((uVar7 >> 4 | uVar8 * -0x70000000) < 0xa3d70b ||
                0x28f5c28 < (uVar7 >> 2 | uVar8 * 0x40000000) && (uVar8 & 3) == 0) + 0x1d;
      }
      else {
        iVar5 = 0x1f;
      }
    }
    if (local_48 < iVar5) {
      local_50 = local_48;
      iVar5 = cbs_get_two_digits(&local_78,&local_38);
      if (local_38 < 0x18 && iVar5 != 0) {
        local_54 = local_38;
        iVar5 = cbs_get_two_digits(&local_78,&local_3c);
        if (local_3c < 0x3c && iVar5 != 0) {
          local_58 = local_3c;
          iVar5 = cbs_get_two_digits(&local_78,&local_40);
          if ((local_40 < 0x3c && iVar5 != 0) && (local_78.len != 0)) {
            puVar1 = local_78.data + 1;
            local_78.len = local_78.len - 1;
            uVar2 = *local_78.data;
            if (uVar2 == 'Z') {
              bVar3 = true;
              iVar5 = 0;
            }
            else {
              if (uVar2 == '-') {
                iVar5 = -1;
              }
              else {
                if (uVar2 != '+') {
                  return 0;
                }
                iVar5 = 1;
              }
              bVar3 = false;
            }
            iVar6 = 0;
            local_78.data = puVar1;
            if (!bVar3) {
              if (allow_timezone_offset == 0) {
                return 0;
              }
              local_5c = iVar5;
              iVar5 = cbs_get_two_digits(&local_78,&local_44);
              bVar3 = false;
              iVar6 = 0;
              if (local_44 < 0x18 && iVar5 != 0) {
                iVar5 = cbs_get_two_digits(&local_78,&local_4c);
                bVar3 = false;
                iVar6 = 0;
                if (local_4c < 0x3c && iVar5 != 0) {
                  iVar6 = (local_4c * 0x3c + local_44 * 0xe10) * local_5c;
                  bVar3 = true;
                }
              }
              if (!bVar3) {
                return 0;
              }
            }
            iVar4 = 0;
            if (local_78.len == 0) {
              if (out_tm != (tm *)0x0) {
                out_tm->tm_year = uVar8 - 0x76c;
                out_tm->tm_mon = local_34 - 1;
                out_tm->tm_mday = local_50;
                out_tm->tm_hour = local_54;
                out_tm->tm_min = local_58;
                out_tm->tm_sec = local_40;
                if ((iVar6 != 0) && (iVar5 = OPENSSL_gmtime_adj(out_tm,0,(long)iVar6), iVar5 == 0))
                {
                  return 0;
                }
              }
              iVar4 = 1;
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int CBS_parse_rfc5280_time_internal(const CBS *cbs, int is_gentime,
                                           int allow_timezone_offset,
                                           struct tm *out_tm) {
  int year, month, day, hour, min, sec, tmp;
  CBS copy = *cbs;
  uint8_t tz;

  if (is_gentime) {
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year = tmp * 100;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
  } else {
    year = 1900;
    if (!cbs_get_two_digits(&copy, &tmp)) {
      return 0;
    }
    year += tmp;
    if (year < 1950) {
      year += 100;
    }
    if (year >= 2050) {
      return 0;  // A Generalized time must be used.
    }
  }
  if (!cbs_get_two_digits(&copy, &month) || month < 1 ||
      month > 12 ||  // Reject invalid months.
      !cbs_get_two_digits(&copy, &day) ||
      !is_valid_day(year, month, day) ||  // Reject invalid days.
      !cbs_get_two_digits(&copy, &hour) ||
      hour > 23 ||  // Reject invalid hours.
      !cbs_get_two_digits(&copy, &min) ||
      min > 59 ||  // Reject invalid minutes.
      !cbs_get_two_digits(&copy, &sec) || sec > 59 || !CBS_get_u8(&copy, &tz)) {
    return 0;
  }

  int offset_sign = 0;
  switch (tz) {
    case 'Z':
      break;  // We correctly have 'Z' on the end as per spec.
    case '+':
      offset_sign = 1;
      break;  // Should not be allowed per RFC 5280.
    case '-':
      offset_sign = -1;
      break;  // Should not be allowed per RFC 5280.
    default:
      return 0;  // Reject anything else after the time.
  }

  // If allow_timezone_offset is non-zero, allow for a four digit timezone
  // offset to be specified even though this is not allowed by RFC 5280. We are
  // permissive of this for UTCTimes due to the unfortunate existence of
  // artisinally rolled long lived certificates that were baked into places that
  // are now difficult to change. These certificates were generated with the
  // 'openssl' command that permissively allowed the creation of certificates
  // with notBefore and notAfter times specified as strings for direct
  // certificate inclusion on the command line. For context see cl/237068815.
  //
  // TODO(bbe): This has been expunged from public web-pki as the ecosystem has
  // managed to encourage CA compliance with standards. We should find a way to
  // get rid of this or make it off by default.
  int offset_seconds = 0;
  if (offset_sign != 0) {
    if (!allow_timezone_offset) {
      return 0;
    }
    int offset_hours, offset_minutes;
    if (!cbs_get_two_digits(&copy, &offset_hours) ||
        offset_hours > 23 ||  // Reject invalid hours.
        !cbs_get_two_digits(&copy, &offset_minutes) ||
        offset_minutes > 59) {  // Reject invalid minutes.
      return 0;
    }
    offset_seconds = offset_sign * (offset_hours * 3600 + offset_minutes * 60);
  }

  if (CBS_len(&copy) != 0) {
    return 0;  // Reject invalid lengths.
  }

  if (out_tm != NULL) {
    // Fill in the tm fields corresponding to what we validated.
    out_tm->tm_year = year - 1900;
    out_tm->tm_mon = month - 1;
    out_tm->tm_mday = day;
    out_tm->tm_hour = hour;
    out_tm->tm_min = min;
    out_tm->tm_sec = sec;
    if (offset_seconds && !OPENSSL_gmtime_adj(out_tm, 0, offset_seconds)) {
      return 0;
    }
  }
  return 1;
}